

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

int rndtrap(level *lev)

{
  boolean bVar1;
  int iVar2;
  
  do {
    iVar2 = rnd(0x18);
    switch(iVar2) {
    case 3:
    case 7:
      if ((lev->z).dnum != dungeon_topology.d_astral_level.dnum) {
        return iVar2;
      }
      break;
    default:
      goto switchD_00243e69_caseD_4;
    case 0xd:
    case 0xf:
    case 0x12:
      break;
    case 0xe:
      bVar1 = can_dig_down(lev);
      if (bVar1 != '\0') {
        return iVar2;
      }
      break;
    case 0x10:
    case 0x11:
      if (((lev->flags).field_0x9 & 8) == 0) {
switchD_00243e69_caseD_4:
        return iVar2;
      }
    }
  } while( true );
}

Assistant:

static int rndtrap(struct level *lev)
{
	int rtrap;

	do {
	    rtrap = rnd(TRAPNUM-1);
	    switch (rtrap) {
	     case HOLE:		/* no random holes on special levels */
             case VIBRATING_SQUARE:
	     case MAGIC_PORTAL:	rtrap = NO_TRAP;
				break;
	     case TRAPDOOR:	if (!can_dig_down(lev)) rtrap = NO_TRAP;
				break;
	     case LEVEL_TELEP:
	     case TELEP_TRAP:	if (lev->flags.noteleport) rtrap = NO_TRAP;
				break;
	     case ROLLING_BOULDER_TRAP:
	     case ROCKTRAP:	if (In_endgame(&lev->z)) rtrap = NO_TRAP;
				break;
	    }
	} while (rtrap == NO_TRAP);
	return rtrap;
}